

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadIntWithoutSign<unsigned_int>
          (TextReader<fmt::Locale> *this,uint *value)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  pbVar2 = (byte *)(this->super_ReaderBase).ptr_;
  bVar4 = *pbVar2;
  bVar1 = bVar4 - 0x30;
  if (bVar1 < 10) {
    uVar5 = 0;
    do {
      uVar6 = (uVar5 * 10 + (uint)bVar4) - 0x30;
      pbVar3 = pbVar2;
      if (uVar6 < uVar5) {
        ReportError<>(this,(CStringRef)0x20f4eb);
        pbVar3 = (byte *)(this->super_ReaderBase).ptr_;
      }
      pbVar2 = pbVar3 + 1;
      (this->super_ReaderBase).ptr_ = (char *)pbVar2;
      bVar4 = pbVar3[1];
      uVar5 = uVar6;
    } while ((byte)(bVar4 - 0x30) < 10);
    *value = uVar6;
  }
  return bVar1 < 10;
}

Assistant:

bool ReadIntWithoutSign(Int& value) {
    char c = *ptr_;
    if (c < '0' || c > '9')
      return false;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    do {
      UInt new_result = result * 10 + (c - '0');
      if (new_result < result)
        ReportError("number is too big");
      result = new_result;
      c = *++ptr_;
    } while (c >= '0' && c <= '9');
    UInt max = std::numeric_limits<Int>::max();
    if (result > max)
      ReportError("number is too big");
    value = result;
    return true;
  }